

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::Instruction
          (Instruction *this,IRContext *c,Op op,uint32_t ty_id,uint32_t res_id,
          OperandList *in_operands)

{
  uint32_t uVar1;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  local_80;
  const_iterator local_78;
  uint32_t local_6c;
  initializer_list<unsigned_int> local_68;
  spv_operand_type_t local_58;
  uint32_t local_54;
  initializer_list<unsigned_int> local_50;
  spv_operand_type_t local_3c;
  size_type local_38;
  size_t operands_size;
  OperandList *in_operands_local;
  uint32_t local_20;
  uint32_t res_id_local;
  uint32_t ty_id_local;
  Op op_local;
  IRContext *c_local;
  Instruction *this_local;
  
  operands_size = (size_t)in_operands;
  in_operands_local._4_4_ = res_id;
  local_20 = ty_id;
  res_id_local = op;
  _ty_id_local = c;
  c_local = (IRContext *)this;
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::IntrusiveNodeBase
            (&this->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_00827bf0;
  this->context_ = _ty_id_local;
  this->opcode_ = res_id_local;
  this->has_type_id_ = local_20 != 0;
  this->has_result_id_ = in_operands_local._4_4_ != 0;
  uVar1 = IRContext::TakeNextUniqueId(_ty_id_local);
  this->unique_id_ = uVar1;
  memset(&this->operands_,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&this->operands_);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
            (&this->dbg_line_insts_);
  DebugScope::DebugScope(&this->dbg_scope_,0,0);
  local_38 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::size
                       ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        operands_size);
  if ((this->has_type_id_ & 1U) != 0) {
    local_38 = local_38 + 1;
  }
  if ((this->has_result_id_ & 1U) != 0) {
    local_38 = local_38 + 1;
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::reserve
            (&this->operands_,local_38);
  if ((this->has_type_id_ & 1U) != 0) {
    local_3c = SPV_OPERAND_TYPE_TYPE_ID;
    local_54 = local_20;
    local_50._M_array = &local_54;
    local_50._M_len = 1;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &this->operands_,&local_3c,&local_50);
  }
  if ((this->has_result_id_ & 1U) != 0) {
    local_58 = SPV_OPERAND_TYPE_RESULT_ID;
    local_6c = in_operands_local._4_4_;
    local_68._M_array = &local_6c;
    local_68._M_len = 1;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &this->operands_,&local_58,&local_68);
  }
  local_80._M_current =
       (Operand *)
       std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::end
                 (&this->operands_);
  __gnu_cxx::
  __normal_iterator<spvtools::opt::Operand_const*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>
  ::__normal_iterator<spvtools::opt::Operand*>
            ((__normal_iterator<spvtools::opt::Operand_const*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>
              *)&local_78,&local_80);
  __first = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::begin
                      ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       operands_size);
  __last = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::end
                     ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                      operands_size);
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand_const*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>,void>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
             &this->operands_,local_78,
             (__normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
              )__first._M_current,
             (__normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
              )__last._M_current);
  return;
}

Assistant:

Instruction::Instruction(IRContext* c, spv::Op op, uint32_t ty_id,
                         uint32_t res_id, const OperandList& in_operands)
    : utils::IntrusiveNodeBase<Instruction>(),
      context_(c),
      opcode_(op),
      has_type_id_(ty_id != 0),
      has_result_id_(res_id != 0),
      unique_id_(c->TakeNextUniqueId()),
      operands_(),
      dbg_scope_(kNoDebugScope, kNoInlinedAt) {
  size_t operands_size = in_operands.size();
  if (has_type_id_) {
    operands_size++;
  }
  if (has_result_id_) {
    operands_size++;
  }
  operands_.reserve(operands_size);
  if (has_type_id_) {
    operands_.emplace_back(spv_operand_type_t::SPV_OPERAND_TYPE_TYPE_ID,
                           std::initializer_list<uint32_t>{ty_id});
  }
  if (has_result_id_) {
    operands_.emplace_back(spv_operand_type_t::SPV_OPERAND_TYPE_RESULT_ID,
                           std::initializer_list<uint32_t>{res_id});
  }
  operands_.insert(operands_.end(), in_operands.begin(), in_operands.end());
}